

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O0

void __thiscall leveldb::TableBuilder::~TableBuilder(TableBuilder *this)

{
  FilterBlockBuilder *this_00;
  Rep *this_01;
  TableBuilder *this_local;
  
  if ((this->rep_->closed & 1U) != 0) {
    this_00 = this->rep_->filter_block;
    if (this_00 != (FilterBlockBuilder *)0x0) {
      FilterBlockBuilder::~FilterBlockBuilder(this_00);
      operator_delete(this_00);
    }
    this_01 = this->rep_;
    if (this_01 != (Rep *)0x0) {
      Rep::~Rep(this_01);
      operator_delete(this_01);
    }
    return;
  }
  __assert_fail("rep_->closed",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_builder.cc"
                ,0x49,"leveldb::TableBuilder::~TableBuilder()");
}

Assistant:

TableBuilder::~TableBuilder() {
  assert(rep_->closed);  // Catch errors where caller forgot to call Finish()
  delete rep_->filter_block;
  delete rep_;
}